

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O3

void P_FreeLevelData(void)

{
  void *pvVar1;
  polyblock_t *ppVar2;
  DInterpolation *pDVar3;
  bool bVar4;
  polyblock_t *ppVar5;
  extsector_t *peVar6;
  FPolyObj *pFVar7;
  int iVar8;
  extsector_t *peVar9;
  xfloor *pxVar10;
  FPolyObj *pFVar11;
  TArray<vertex_t_*,_vertex_t_*> *pTVar12;
  long lVar13;
  plane *ppVar14;
  long lVar15;
  subsector_t *psVar16;
  TArray<line_t_*,_line_t_*> *pTVar17;
  midtex *pmVar18;
  TArray<FPolyVertex,_FPolyVertex> *pTVar19;
  plane *ppVar20;
  long lVar21;
  ulong uVar22;
  TArray<FPolyVertex,_FPolyVertex> *pTVar23;
  TArray<lightlist_t,_lightlist_t> *local_a0;
  TArray<sector_t_*,_sector_t_*> *local_98;
  linked *local_90;
  TArray<line_t_*,_line_t_*> *local_88;
  
  FInterpolator::ClearInterpolations(&interpolator);
  (*Renderer->_vptr_FRenderer[0x17])();
  FPolyObj::ClearAllSubsectorLinks();
  SN_StopAllSequences();
  DThinker::DestroyAllThinkers();
  P_ClearPortals();
  FTagManager::Clear(&tagManager);
  wminfo.maxfrags = 0;
  level.total_secrets = 0;
  level.found_secrets = 0;
  level.total_items = 0;
  level.found_items = 0;
  level.total_monsters = 0;
  level.killed_monsters = 0;
  FBehavior::StaticUnloadModules();
  if (vertexes != (vertex_t *)0x0) {
    operator_delete__(vertexes);
    vertexes = (vertex_t *)0x0;
  }
  numvertexes = 0;
  if (segs != (seg_t *)0x0) {
    operator_delete__(segs);
    segs = (seg_t *)0x0;
  }
  numsegs = 0;
  if (glsegextras != (glsegextra_t *)0x0) {
    operator_delete__(glsegextras);
    glsegextras = (glsegextra_t *)0x0;
  }
  if (sectors != (sector_t *)0x0) {
    peVar9 = sectors->e;
    if (peVar9 == (extsector_t *)0x0) {
LAB_00566a7c:
      operator_delete__(sectors);
    }
    else {
      peVar6 = peVar9 + -1;
      lVar21 = *(long *)&peVar9[-1].vertices.Most;
      if (lVar21 != 0) {
        lVar13 = lVar21 * 0xb0;
        pTVar17 = &peVar9[-1].Midtex.Floor.AttachedLines;
        local_88 = &peVar9[-1].Midtex.Ceiling.AttachedLines;
        ppVar14 = &peVar9[-1].Midtex.Ceiling;
        pmVar18 = &peVar9[-1].Midtex;
        ppVar20 = &peVar9[-1].Linked.Ceiling;
        local_90 = &peVar9[-1].Linked;
        local_a0 = &peVar9[-1].XFloor.lightlist;
        local_98 = &peVar9[-1].XFloor.attached;
        pxVar10 = &peVar9[-1].XFloor;
        pTVar12 = &peVar9[-1].vertices;
        lVar15 = 0;
        do {
          peVar9 = peVar9 + -1;
          TArray<vertex_t_*,_vertex_t_*>::~TArray(pTVar12 + lVar21 * 0xb);
          TArray<sector_t_*,_sector_t_*>::~TArray(local_98 + lVar21 * 0xb);
          TArray<lightlist_t,_lightlist_t>::~TArray(local_a0 + lVar21 * 0xb);
          TDeletingArray<F3DFloor_*,_F3DFloor_*>::~TDeletingArray
                    ((TDeletingArray<F3DFloor_*,_F3DFloor_*> *)((long)pxVar10 + lVar13));
          TArray<FLinkedSector,_FLinkedSector>::~TArray(&ppVar20[lVar21 * 0xb].Sectors);
          TArray<FLinkedSector,_FLinkedSector>::~TArray
                    ((TArray<FLinkedSector,_FLinkedSector> *)((long)local_90 + lVar13));
          TArray<line_t_*,_line_t_*>::~TArray(local_88 + lVar21 * 0xb);
          TArray<sector_t_*,_sector_t_*>::~TArray
                    ((TArray<sector_t_*,_sector_t_*> *)(lVar13 + (long)ppVar14));
          TArray<line_t_*,_line_t_*>::~TArray(pTVar17 + lVar21 * 0xb);
          TArray<sector_t_*,_sector_t_*>::~TArray
                    ((TArray<sector_t_*,_sector_t_*> *)(lVar13 + (long)pmVar18));
          TArray<sector_t_*,_sector_t_*>::~TArray
                    ((TArray<sector_t_*,_sector_t_*> *)(peVar9 + lVar21));
          pTVar17 = pTVar17 + -0xb;
          local_88 = local_88 + -0xb;
          ppVar14 = (plane *)((long)(ppVar14 + -6) + 0x10);
          pmVar18 = (midtex *)((long)(pmVar18 + -3) + 0x10);
          ppVar20 = ppVar20 + -0xb;
          local_90 = (linked *)((long)(local_90 + -6) + 0x10);
          local_a0 = local_a0 + -0xb;
          local_98 = local_98 + -0xb;
          pxVar10 = (xfloor *)((long)(pxVar10 + -4) + 0x10);
          pTVar12 = pTVar12 + -0xb;
          lVar15 = lVar15 + 0xb0;
        } while (lVar13 - lVar15 != 0);
      }
      operator_delete__(&(peVar6->vertices).Most,lVar21 * 0xb0 | 8);
      if (sectors != (sector_t *)0x0) goto LAB_00566a7c;
    }
    sectors = (sector_t *)0x0;
  }
  numsectors = 0;
  if ((gamenodes != (node_t *)0x0) && (gamenodes != nodes)) {
    operator_delete__(gamenodes);
  }
  if (gamesubsectors != subsectors && gamesubsectors != (subsector_t *)0x0) {
    operator_delete__(gamesubsectors);
  }
  if (subsectors != (subsector_t *)0x0) {
    psVar16 = subsectors;
    if (0 < numsubsectors) {
      lVar21 = 0x10;
      lVar13 = 0;
      iVar8 = numsubsectors;
      do {
        pvVar1 = *(void **)((long)&((subsector_t *)(psVar16->portalcoverage + -4))->sector + lVar21)
        ;
        if (pvVar1 != (void *)0x0) {
          TArray<vertex_t,_vertex_t>::~TArray((TArray<vertex_t,_vertex_t> *)((long)pvVar1 + 0x38));
          TArray<subsector_t,_subsector_t>::~TArray
                    ((TArray<subsector_t,_subsector_t> *)((long)pvVar1 + 0x28));
          TArray<seg_t,_seg_t>::~TArray((TArray<seg_t,_seg_t> *)((long)pvVar1 + 0x18));
          TArray<node_t,_node_t>::~TArray((TArray<node_t,_node_t> *)((long)pvVar1 + 8));
          operator_delete(pvVar1,0x48);
          psVar16 = subsectors;
          iVar8 = numsubsectors;
        }
        lVar13 = lVar13 + 1;
        lVar21 = lVar21 + 0x60;
      } while (lVar13 < iVar8);
      if (psVar16 == (subsector_t *)0x0) goto LAB_00566b55;
    }
    operator_delete__(psVar16);
  }
LAB_00566b55:
  if (nodes != (node_t *)0x0) {
    operator_delete__(nodes);
  }
  gamesubsectors = (subsector_t *)0x0;
  subsectors = (subsector_t *)0x0;
  numgamesubsectors = 0;
  numsubsectors = 0;
  gamenodes = (node_t *)0x0;
  nodes = (node_t *)0x0;
  numgamenodes = 0;
  numnodes = 0;
  if (lines != (line_t *)0x0) {
    operator_delete__(lines);
    lines = (line_t *)0x0;
  }
  numlines = 0;
  if (sides != (side_t *)0x0) {
    operator_delete__(sides);
    sides = (side_t *)0x0;
  }
  numsides = 0;
  if (blockmaplump != (int *)0x0) {
    operator_delete__(blockmaplump);
    blockmaplump = (int *)0x0;
  }
  if (blocklinks != (FBlockNode **)0x0) {
    operator_delete__(blocklinks);
    blocklinks = (FBlockNode **)0x0;
  }
  if (PolyBlockMap == (polyblock_t **)0x0) goto LAB_00566c87;
  if (bmapheight * bmapwidth < 1) {
LAB_00566c7b:
    operator_delete__(PolyBlockMap);
  }
  else {
    uVar22 = (ulong)(uint)(bmapheight * bmapwidth);
    do {
      ppVar5 = PolyBlockMap[uVar22 - 1];
      while (ppVar5 != (polyblock_t *)0x0) {
        ppVar2 = ppVar5->next;
        operator_delete(ppVar5,0x18);
        ppVar5 = ppVar2;
      }
      bVar4 = 1 < (long)uVar22;
      uVar22 = uVar22 - 1;
    } while (bVar4);
    if (PolyBlockMap != (polyblock_t **)0x0) goto LAB_00566c7b;
  }
  PolyBlockMap = (polyblock_t **)0x0;
LAB_00566c87:
  if (rejectmatrix != (BYTE *)0x0) {
    operator_delete__(rejectmatrix);
    rejectmatrix = (BYTE *)0x0;
  }
  if (linebuffer != (line_t **)0x0) {
    operator_delete__(linebuffer);
    linebuffer = (line_t **)0x0;
  }
  if (polyobjs != (FPolyObj *)0x0) {
    pFVar7 = polyobjs + -1;
    pDVar3 = polyobjs[-1].interpolation.field_0.p;
    if (pDVar3 != (DInterpolation *)0x0) {
      pTVar17 = &polyobjs[-1].Linedefs;
      pTVar12 = &polyobjs[-1].Vertices;
      pTVar19 = &polyobjs[-1].OriginalPts;
      pTVar23 = &polyobjs[-1].PrevPts;
      lVar21 = 0;
      pFVar11 = polyobjs;
      do {
        pFVar11 = pFVar11 + -1;
        TArray<FPolyVertex,_FPolyVertex>::~TArray(pTVar23 + (long)pDVar3 * 0xf);
        TArray<FPolyVertex,_FPolyVertex>::~TArray(pTVar19 + (long)pDVar3 * 0xf);
        TArray<vertex_t_*,_vertex_t_*>::~TArray(pTVar12 + (long)pDVar3 * 0xf);
        TArray<line_t_*,_line_t_*>::~TArray(pTVar17 + (long)pDVar3 * 0xf);
        TArray<side_t_*,_side_t_*>::~TArray(&pFVar11[(long)pDVar3].Sidedefs);
        pTVar17 = pTVar17 + -0xf;
        pTVar12 = pTVar12 + -0xf;
        pTVar19 = pTVar19 + -0xf;
        pTVar23 = pTVar23 + -0xf;
        lVar21 = lVar21 + 0xf0;
      } while ((long)pDVar3 * 0xf0 != lVar21);
    }
    operator_delete__(&pFVar7->interpolation,(long)pDVar3 * 0xf0 | 8);
    polyobjs = (FPolyObj *)0x0;
  }
  po_NumPolyobjs = 0;
  if (zones != (zone_t *)0x0) {
    operator_delete__(zones);
    zones = (zone_t *)0x0;
  }
  numzones = 0;
  P_FreeStrifeConversations();
  if (level.Scrolls != (FSectorScrollValues *)0x0) {
    operator_delete__(level.Scrolls);
    level.Scrolls = (FSectorScrollValues *)0x0;
  }
  P_ClearUDMFKeys();
  return;
}

Assistant:

void P_FreeLevelData ()
{
	interpolator.ClearInterpolations();	// [RH] Nothing to interpolate on a fresh level.
	Renderer->CleanLevelData();
	FPolyObj::ClearAllSubsectorLinks(); // can't be done as part of the polyobj deletion process.
	SN_StopAllSequences ();
	DThinker::DestroyAllThinkers ();
	P_ClearPortals();
	tagManager.Clear();
	level.total_monsters = level.total_items = level.total_secrets =
		level.killed_monsters = level.found_items = level.found_secrets =
		wminfo.maxfrags = 0;
		
	FBehavior::StaticUnloadModules ();
	if (vertexes != NULL)
	{
		delete[] vertexes;
		vertexes = NULL;
	}
	numvertexes = 0;
	if (segs != NULL)
	{
		delete[] segs;
		segs = NULL;
	}
	numsegs = 0;
	if (glsegextras != NULL)
	{
		delete[] glsegextras;
		glsegextras = NULL;
	}
	if (sectors != NULL)
	{
		delete[] sectors[0].e;
		delete[] sectors;
		sectors = NULL;
	}
	numsectors = 0;
	if (gamenodes != NULL && gamenodes != nodes)
	{
		delete[] gamenodes;
	}
	if (gamesubsectors != NULL && gamesubsectors != subsectors)
	{
		delete[] gamesubsectors;
	}
	if (subsectors != NULL)
	{
		for (int i = 0; i < numsubsectors; ++i)
		{
			if (subsectors[i].BSP != NULL)
			{
				delete subsectors[i].BSP;
			}
		}
		delete[] subsectors;
	}
	if (nodes != NULL)
	{
		delete[] nodes;
	}
	subsectors = gamesubsectors = NULL;
	numsubsectors = numgamesubsectors = 0;
	nodes = gamenodes = NULL;
	numnodes = numgamenodes = 0;
	if (lines != NULL)
	{
		delete[] lines;
		lines = NULL;
	}
	numlines = 0;
	if (sides != NULL)
	{
		delete[] sides;
		sides = NULL;
	}
	numsides = 0;

	if (blockmaplump != NULL)
	{
		delete[] blockmaplump;
		blockmaplump = NULL;
	}
	if (blocklinks != NULL)
	{
		delete[] blocklinks;
		blocklinks = NULL;
	}
	if (PolyBlockMap != NULL)
	{
		for (int i = bmapwidth*bmapheight-1; i >= 0; --i)
		{
			polyblock_t *link = PolyBlockMap[i];
			while (link != NULL)
			{
				polyblock_t *next = link->next;
				delete link;
				link = next;
			}
		}
		delete[] PolyBlockMap;
		PolyBlockMap = NULL;
	}
	if (rejectmatrix != NULL)
	{
		delete[] rejectmatrix;
		rejectmatrix = NULL;
	}
	if (linebuffer != NULL)
	{
		delete[] linebuffer;
		linebuffer = NULL;
	}
	if (polyobjs != NULL)
	{
		delete[] polyobjs;
		polyobjs = NULL;
	}
	po_NumPolyobjs = 0;
	if (zones != NULL)
	{
		delete[] zones;
		zones = NULL;
	}
	numzones = 0;
	P_FreeStrifeConversations ();
	if (level.Scrolls != NULL)
	{
		delete[] level.Scrolls;
		level.Scrolls = NULL;
	}
	P_ClearUDMFKeys();
}